

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall ON_FontList::Internal_UpdateSortedLists(ON_FontList *this)

{
  ON_SimpleArray<const_ON_Font_*> *this_00;
  bool bVar1;
  bool bVar2;
  ON_SHA1_Hash *pOVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  NameLocale name_locale;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  ON_wString OStack_c8;
  ON_Font *font;
  ON_wString en;
  ON_wString local_78 [4];
  ON_wString local_58;
  ON_SimpleArray<const_ON_Font_*> *local_50;
  ON_SimpleArray<const_ON_Font_*> *local_48;
  ON_FontListImpl *local_40;
  
  lVar6 = (long)(this->m_unsorted).m_count;
  if (0 < lVar6) {
    local_40 = this->m_sorted;
    auVar9._8_4_ = (int)local_40;
    auVar9._0_8_ = local_40;
    auVar9._12_4_ = (int)((ulong)local_40 >> 0x20);
    local_78[2].m_s = (wchar_t *)&local_40->m_by_family_name;
    local_78[3].m_s = (wchar_t *)(auVar9._8_8_ + 0x60);
    local_78[0].m_s = (wchar_t *)&local_40->m_by_postscript_name;
    local_78[1].m_s = (wchar_t *)(auVar9._8_8_ + 0x30);
    local_58.m_s = (wchar_t *)&local_40->m_by_english_windows_logfont_name;
    local_50 = &local_40->m_by_english_family_name;
    local_48 = &local_40->m_by_quartet_name;
    for (uVar8 = 0; uVar8 != 8; uVar8 = uVar8 + 1) {
      this_00 = (ON_SimpleArray<const_ON_Font_*> *)local_78[uVar8].m_s;
      ON_SimpleArray<const_ON_Font_*>::Reserve(this_00,this_00->m_count + lVar6);
      bVar2 = false;
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
        font = (this->m_unsorted).m_a[lVar7];
        if (font == (ON_Font *)0x0) goto LAB_0049be43;
        name_locale = (NameLocale)font;
        switch(uVar8 & 0xffffffff) {
        case 0:
          ON_Font::PostScriptName((ON_Font *)&en,name_locale);
          bVar1 = ON_wString::IsEmpty(&en);
          break;
        case 1:
          ON_Font::WindowsLogfontName((ON_Font *)&en,name_locale);
          bVar1 = ON_wString::IsEmpty(&en);
          break;
        case 2:
          ON_Font::FamilyName((ON_Font *)&en,name_locale);
          bVar1 = ON_wString::IsEmpty(&en);
          break;
        case 3:
          ON_Font::PostScriptName((ON_Font *)&en,name_locale);
          bVar1 = ON_wString::IsEmpty(&en);
          if (bVar1) {
LAB_0049bde8:
            ON_wString::~ON_wString(&en);
            goto LAB_0049be43;
          }
          pwVar4 = ON_wString::operator_cast_to_wchar_t_(&en);
          ON_Font::PostScriptName((ON_Font *)&OStack_c8,(NameLocale)font);
          pwVar5 = ON_wString::operator_cast_to_wchar_t_(&OStack_c8);
          bVar1 = ON_wString::EqualOrdinal(pwVar4,pwVar5,true);
          goto LAB_0049bdba;
        case 4:
          ON_Font::WindowsLogfontName((ON_Font *)&en,name_locale);
          bVar1 = ON_wString::IsEmpty(&en);
          if (bVar1) goto LAB_0049bde8;
          pwVar4 = ON_wString::operator_cast_to_wchar_t_(&en);
          ON_Font::WindowsLogfontName((ON_Font *)&OStack_c8,(NameLocale)font);
          pwVar5 = ON_wString::operator_cast_to_wchar_t_(&OStack_c8);
          bVar1 = ON_wString::EqualOrdinal(pwVar4,pwVar5,true);
          goto LAB_0049bdba;
        case 5:
          ON_Font::FamilyName((ON_Font *)&en,name_locale);
          bVar1 = ON_wString::IsEmpty(&en);
          if (bVar1) goto LAB_0049bde8;
          pwVar4 = ON_wString::operator_cast_to_wchar_t_(&en);
          ON_Font::FamilyName((ON_Font *)&OStack_c8,(NameLocale)font);
          pwVar5 = ON_wString::operator_cast_to_wchar_t_(&OStack_c8);
          bVar1 = ON_wString::EqualOrdinal(pwVar4,pwVar5,true);
LAB_0049bdba:
          ON_wString::~ON_wString(&OStack_c8);
          break;
        case 6:
          ON_Font::QuartetName((ON_Font *)&en);
          bVar1 = ON_wString::IsEmpty(&en);
          if (bVar1) goto LAB_0049bde8;
          if (-1 < (this->m_quartet_list).m_capacity) {
            (this->m_quartet_list).m_count = 0;
          }
          ON_wString::~ON_wString(&en);
          goto LAB_0049be2d;
        case 7:
          pOVar3 = ON_Font::FontCharacteristicsHash(font);
          en.m_s = *(wchar_t **)pOVar3->m_digest;
          bVar1 = ON_SHA1_Hash::IsZeroDigestOrEmptyContentHash((ON_SHA1_Hash *)&en);
          if (bVar1) goto LAB_0049be43;
          goto LAB_0049be2d;
        default:
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                     ,0xfb9,"",
                     "When you add an array to ON_FontListImpl, you must add a corresponding if clause here."
                    );
          goto LAB_0049be2d;
        }
        ON_wString::~ON_wString(&en);
        if (bVar1 == false) {
LAB_0049be2d:
          ON_SimpleArray<const_ON_Font_*>::Append(this_00,&font);
          bVar2 = true;
        }
LAB_0049be43:
      }
      if (bVar2) {
        ON_SimpleArray<const_ON_Font_*>::QuickSort
                  (this_00,(_func_int_ON_Font_ptr_ptr_ON_Font_ptr_ptr *)
                           (&PTR_Internal_ComparePostScriptNameEtc_008218c0)[uVar8]);
      }
    }
    if (-1 < (this->m_unsorted).m_capacity) {
      (this->m_unsorted).m_count = 0;
    }
  }
  return;
}

Assistant:

const ON__UINT8* ON_PANOSE1::TenBytes() const
{
  return (const ON__UINT8*)(&m_family_kind);
}